

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_luma_mode_18_34
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < nt) {
    iVar1 = 0x20;
    if (mode == 0x12) {
      iVar1 = -0x20;
    }
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      uVar3 = 0;
      do {
        pu1_dst[uVar3] = pu1_ref[(long)(((int)uVar2 * iVar1 >> 5) + nt * 2 + (int)uVar3) + 1];
        uVar3 = uVar3 + 1;
      } while ((uint)nt != uVar3);
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar2 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_18_34(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{
    WORD32 row, col;
    WORD32 intra_pred_ang;
    WORD32 idx = 0;
    WORD32 two_nt = 2 * nt;
    UNUSED(src_strd);
    intra_pred_ang = 32;    /*Default value*/

    /* For mode 18, angle is -45degree */
    if(mode == 18)
        intra_pred_ang = -32;
    /* For mode 34, angle is 45degree */
    else if(mode == 34)
        intra_pred_ang = 32;
    /* For the angle 45 and -45, replication is done from the corresponding angle */
    /* No interpolation is done for 45 degree*/
    for(row = 0; row < nt; row++)
    {
        idx = ((row + 1) * intra_pred_ang) >> 5;
#if OPT
        if(mode == 18)
            idx--;
        if(mode == 34)
            idx++;
#endif
        for(col = 0; col < nt; col++)
            pu1_dst[col + (row * dst_strd)] = pu1_ref[two_nt + col + idx + 1];

    }

}